

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O0

void __thiscall pstack::Procman::StackFrame::getCoreRegs(StackFrame *this,CoreRegisters *core)

{
  Addr AVar1;
  CoreRegisters *core_local;
  StackFrame *this_local;
  
  AVar1 = Elf::getReg(&this->regs,0);
  core->rax = AVar1;
  AVar1 = Elf::getReg(&this->regs,1);
  core->rdx = AVar1;
  AVar1 = Elf::getReg(&this->regs,2);
  core->rcx = AVar1;
  AVar1 = Elf::getReg(&this->regs,3);
  core->rbx = AVar1;
  AVar1 = Elf::getReg(&this->regs,4);
  core->rsi = AVar1;
  AVar1 = Elf::getReg(&this->regs,5);
  core->rdi = AVar1;
  AVar1 = Elf::getReg(&this->regs,6);
  core->rbp = AVar1;
  AVar1 = Elf::getReg(&this->regs,7);
  core->rsp = AVar1;
  AVar1 = Elf::getReg(&this->regs,8);
  core->r8 = AVar1;
  AVar1 = Elf::getReg(&this->regs,9);
  core->r9 = AVar1;
  AVar1 = Elf::getReg(&this->regs,10);
  core->r10 = AVar1;
  AVar1 = Elf::getReg(&this->regs,0xb);
  core->r11 = AVar1;
  AVar1 = Elf::getReg(&this->regs,0xc);
  core->r12 = AVar1;
  AVar1 = Elf::getReg(&this->regs,0xd);
  core->r13 = AVar1;
  AVar1 = Elf::getReg(&this->regs,0xe);
  core->r14 = AVar1;
  AVar1 = Elf::getReg(&this->regs,0xf);
  core->r15 = AVar1;
  AVar1 = Elf::getReg(&this->regs,0x10);
  core->rip = AVar1;
  AVar1 = Elf::getReg(&this->regs,0x31);
  core->eflags = AVar1;
  AVar1 = Elf::getReg(&this->regs,0x32);
  core->es = AVar1;
  AVar1 = Elf::getReg(&this->regs,0x33);
  core->cs = AVar1;
  AVar1 = Elf::getReg(&this->regs,0x34);
  core->ss = AVar1;
  AVar1 = Elf::getReg(&this->regs,0x35);
  core->ds = AVar1;
  AVar1 = Elf::getReg(&this->regs,0x36);
  core->fs = AVar1;
  AVar1 = Elf::getReg(&this->regs,0x37);
  core->gs = AVar1;
  AVar1 = Elf::getReg(&this->regs,0x3a);
  core->fs_base = AVar1;
  AVar1 = Elf::getReg(&this->regs,0x3b);
  core->gs_base = AVar1;
  return;
}

Assistant:

void
StackFrame::getCoreRegs(Elf::CoreRegisters &core) const
{
#define REGMAP(number, field) core.field = Elf::getReg(regs, number);
#include "libpstack/archreg.h"
#undef REGMAP
}